

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

void ImportModuleNamespaces(ParseContext *ctx,Lexeme *pos,ByteCode *bCode)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  SynNamespaceElement **ppSVar4;
  SynIdentifier *this;
  Lexeme *begin;
  Lexeme *end;
  SynNamespaceElement *this_00;
  SynNamespaceElement *local_98;
  InplaceStr local_90;
  SynIdentifier *local_80;
  SynIdentifier *nameIdentifier;
  SynNamespaceElement *pSStack_70;
  uint k;
  SynNamespaceElement *parent;
  char *name;
  ExternNamespaceInfo *ns;
  ExternNamespaceInfo *pEStack_50;
  uint i;
  ExternNamespaceInfo *namespaceList;
  char *symbols;
  TraceScope traceScope;
  ByteCode *bCode_local;
  Lexeme *pos_local;
  ParseContext *ctx_local;
  
  if ((ImportModuleNamespaces(ParseContext&,Lexeme*,ByteCode*)::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&ImportModuleNamespaces(ParseContext&,Lexeme*,ByteCode*)::token),
     iVar2 != 0)) {
    ImportModuleNamespaces::token = NULLC::TraceGetToken("parser","ImportModuleNamespaces");
    __cxa_guard_release(&ImportModuleNamespaces(ParseContext&,Lexeme*,ByteCode*)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&symbols,ImportModuleNamespaces::token);
  namespaceList = (ExternNamespaceInfo *)FindSymbols(bCode);
  pEStack_50 = FindFirstNamespace(bCode);
  ns._4_4_ = 0;
  do {
    if (bCode->namespaceCount <= ns._4_4_) {
      NULLC::TraceScope::~TraceScope((TraceScope *)&symbols);
      return;
    }
    name = (char *)(pEStack_50 + ns._4_4_);
    parent = (SynNamespaceElement *)
             ((long)&namespaceList->offsetToName +
             (ulong)((ExternNamespaceInfo *)name)->offsetToName);
    pSStack_70 = (SynNamespaceElement *)0x0;
    if (((ExternNamespaceInfo *)name)->parentHash != 0xffffffff) {
      for (nameIdentifier._4_4_ = 0; uVar1 = nameIdentifier._4_4_,
          uVar3 = SmallArray<SynNamespaceElement_*,_32U>::size(&ctx->namespaceList), uVar1 < uVar3;
          nameIdentifier._4_4_ = nameIdentifier._4_4_ + 1) {
        ppSVar4 = SmallArray<SynNamespaceElement_*,_32U>::operator[]
                            (&ctx->namespaceList,nameIdentifier._4_4_);
        if ((*ppSVar4)->fullNameHash == *(uint *)(name + 4)) {
          ppSVar4 = SmallArray<SynNamespaceElement_*,_32U>::operator[]
                              (&ctx->namespaceList,nameIdentifier._4_4_);
          pSStack_70 = *ppSVar4;
          break;
        }
      }
      if (pSStack_70 == (SynNamespaceElement *)0x0) {
        anon_unknown.dwarf_11716f::Stop(ctx,pos,"ERROR: namespace %s parent not found",parent);
      }
    }
    this = ParseContext::get<SynIdentifier>(ctx);
    begin = ParseContext::Previous(ctx);
    end = ParseContext::Previous(ctx);
    InplaceStr::InplaceStr(&local_90,(char *)parent);
    SynIdentifier::SynIdentifier(this,begin,end,local_90);
    local_80 = this;
    this_00 = ParseContext::get<SynNamespaceElement>(ctx);
    SynNamespaceElement::SynNamespaceElement(this_00,pSStack_70,local_80);
    local_98 = this_00;
    SmallArray<SynNamespaceElement_*,_32U>::push_back(&ctx->namespaceList,&local_98);
    ns._4_4_ = ns._4_4_ + 1;
  } while( true );
}

Assistant:

void ImportModuleNamespaces(ParseContext &ctx, Lexeme *pos, ByteCode *bCode)
{
	TRACE_SCOPE("parser", "ImportModuleNamespaces");

	char *symbols = FindSymbols(bCode);

	// Import namespaces
	ExternNamespaceInfo *namespaceList = FindFirstNamespace(bCode);

	for(unsigned i = 0; i < bCode->namespaceCount; i++)
	{
		ExternNamespaceInfo &ns = namespaceList[i];

		const char *name = symbols + ns.offsetToName;

		SynNamespaceElement *parent = NULL;

		if(ns.parentHash != ~0u)
		{
			for(unsigned k = 0; k < ctx.namespaceList.size(); k++)
			{
				if(ctx.namespaceList[k]->fullNameHash == ns.parentHash)
				{
					parent = ctx.namespaceList[k];
					break;
				}
			}

			if(!parent)
				Stop(ctx, pos, "ERROR: namespace %s parent not found", name);
		}

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), InplaceStr(name));

		ctx.namespaceList.push_back(new (ctx.get<SynNamespaceElement>()) SynNamespaceElement(parent, nameIdentifier));
	}
}